

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O0

string * __thiscall test_flash_attn_ext::vars_abi_cxx11_(test_flash_attn_ext *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  float *in_stack_fffffffffffffa18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_5c0 [12];
  ggml_prec in_stack_fffffffffffffa4c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa58;
  string local_5a0 [8];
  array<int,_4UL> *in_stack_fffffffffffffa68;
  string local_580 [32];
  string local_560 [32];
  string local_540 [32];
  string local_520 [32];
  string local_500 [32];
  string local_4e0 [32];
  string local_4c0 [32];
  string local_4a0 [32];
  string local_480 [32];
  string local_460 [32];
  string local_440 [32];
  string local_420 [32];
  string local_400 [32];
  string local_3e0 [32];
  string local_3c0 [32];
  string local_3a0 [32];
  string local_380 [32];
  string local_360 [32];
  string local_340 [32];
  string local_320 [48];
  string local_2f0 [32];
  string local_2d0 [32];
  string local_2b0 [32];
  string local_290 [32];
  string local_270 [32];
  string local_250 [32];
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  string local_30 [48];
  
  __lhs = in_RDI;
  var_to_str<long>((long *)in_stack_fffffffffffffa18);
  std::operator+((char *)__lhs,in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  var_to_str<long>((long *)in_stack_fffffffffffffa18);
  std::operator+((char *)__lhs,in_RDI);
  std::operator+(in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
  std::operator+(__lhs,(char *)in_RDI);
  var_to_str<long>((long *)in_stack_fffffffffffffa18);
  std::operator+((char *)__lhs,in_RDI);
  std::operator+(in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
  std::operator+(__lhs,(char *)in_RDI);
  var_to_str<long>((long *)in_stack_fffffffffffffa18);
  std::operator+((char *)__lhs,in_RDI);
  std::operator+(in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
  std::operator+(__lhs,(char *)in_RDI);
  var_to_str<long>((long *)in_stack_fffffffffffffa18);
  std::operator+((char *)__lhs,in_RDI);
  std::operator+(in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
  std::operator+(__lhs,(char *)in_RDI);
  var_to_str<long>((long *)in_stack_fffffffffffffa18);
  std::operator+((char *)__lhs,in_RDI);
  std::operator+(in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
  std::operator+(__lhs,(char *)in_RDI);
  var_to_str<bool>((bool *)in_stack_fffffffffffffa18);
  std::operator+((char *)__lhs,in_RDI);
  std::operator+(in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
  std::operator+(__lhs,(char *)in_RDI);
  var_to_str<float>(in_stack_fffffffffffffa18);
  std::operator+((char *)__lhs,in_RDI);
  std::operator+(in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
  std::operator+(__lhs,(char *)in_RDI);
  var_to_str<float>(in_stack_fffffffffffffa18);
  std::operator+((char *)__lhs,in_RDI);
  std::operator+(in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
  std::operator+(__lhs,(char *)in_RDI);
  var_to_str_abi_cxx11_(in_stack_fffffffffffffa4c);
  std::operator+((char *)__lhs,in_RDI);
  std::operator+(in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
  std::operator+(__lhs,(char *)in_RDI);
  var_to_str_abi_cxx11_(in_stack_fffffffffffffa4c);
  std::operator+((char *)__lhs,in_RDI);
  std::operator+(in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
  std::operator+(__lhs,(char *)in_RDI);
  var_to_str<int,4ul>(in_stack_fffffffffffffa68);
  std::operator+((char *)__lhs,in_RDI);
  std::operator+(in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
  std::__cxx11::string::~string(local_5a0);
  std::__cxx11::string::~string(local_5c0);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_560);
  std::__cxx11::string::~string(local_580);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_520);
  std::__cxx11::string::~string(local_540);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string(local_4e0);
  std::__cxx11::string::~string(local_500);
  std::__cxx11::string::~string(local_f0);
  std::__cxx11::string::~string(local_110);
  std::__cxx11::string::~string(local_4a0);
  std::__cxx11::string::~string(local_4c0);
  std::__cxx11::string::~string(local_130);
  std::__cxx11::string::~string(local_150);
  std::__cxx11::string::~string(local_460);
  std::__cxx11::string::~string(local_480);
  std::__cxx11::string::~string(local_170);
  std::__cxx11::string::~string(local_190);
  std::__cxx11::string::~string(local_420);
  std::__cxx11::string::~string(local_440);
  std::__cxx11::string::~string(local_1b0);
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::string::~string(local_3e0);
  std::__cxx11::string::~string(local_400);
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::string::~string(local_210);
  std::__cxx11::string::~string(local_3a0);
  std::__cxx11::string::~string(local_3c0);
  std::__cxx11::string::~string(local_230);
  std::__cxx11::string::~string(local_250);
  std::__cxx11::string::~string(local_360);
  std::__cxx11::string::~string(local_380);
  std::__cxx11::string::~string(local_270);
  std::__cxx11::string::~string(local_290);
  std::__cxx11::string::~string(local_320);
  std::__cxx11::string::~string(local_340);
  std::__cxx11::string::~string(local_2b0);
  std::__cxx11::string::~string(local_2d0);
  std::__cxx11::string::~string(local_2f0);
  return __lhs;
}

Assistant:

std::string vars() override {
        return VARS_TO_STR12(hsk, hsv, nh, nr, kv, nb, mask, max_bias, logit_softcap, prec, type_KV, permute);
    }